

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::udp_tracker_connection::on_connect_response
          (udp_tracker_connection *this,span<const_char> buf)

{
  int iVar1;
  type tVar2;
  mapped_type *pmVar3;
  time_point tVar4;
  long lVar5;
  bool bVar6;
  key_type local_50;
  char *local_30;
  long local_28;
  
  lVar5 = buf.m_len;
  if (0xf < lVar5) {
    timeout_handler::restart_read_timeout((timeout_handler *)this);
    local_30 = buf.m_ptr + 8;
    local_28 = lVar5 + -8;
    update_transaction_id(this);
    tVar2 = read_impl<long,char_const>(&local_30);
    ::std::mutex::lock((mutex *)m_cache_mutex);
    bVar6 = (this->m_target).impl_.data_.base.sa_family != 2;
    if (bVar6) {
      local_50.ipv6_address_.addr_.__in6_u._0_8_ =
           *(undefined8 *)((long)&(this->m_target).impl_.data_ + 8);
      local_50.ipv6_address_.addr_.__in6_u._8_8_ =
           *(undefined8 *)((long)&(this->m_target).impl_.data_ + 0x10);
      local_50.ipv6_address_.scope_id_ =
           (unsigned_long)(this->m_target).impl_.data_.v6.sin6_scope_id;
      local_50.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
    }
    else {
      local_50.ipv4_address_.addr_.s_addr =
           (in4_addr_type)(this->m_target).impl_.data_.v4.sin_addr.s_addr;
      local_50.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_50.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_50.ipv6_address_.scope_id_ = 0;
    }
    local_50.type_ = (anon_enum_32)bVar6;
    pmVar3 = ::std::
             map<boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
             ::operator[]((map<boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
                           *)m_connection_cache,&local_50);
    pmVar3->connection_id = tVar2;
    tVar4 = time_now();
    iVar1 = session_settings::get_int(((this->super_tracker_connection).m_man)->m_settings,0x4045);
    (pmVar3->expires).__d.__r = (long)iVar1 * 1000000000 + (long)tVar4.__d.__r;
    if (((this->super_tracker_connection).m_req.kind.m_val & 1) == 0) {
      send_udp_announce(this);
    }
    else {
      send_udp_scrape(this);
    }
    pthread_mutex_unlock((pthread_mutex_t *)m_cache_mutex);
  }
  return 0xf < lVar5;
}

Assistant:

bool udp_tracker_connection::on_connect_response(span<char const> buf)
	{
		// ignore packets smaller than 16 bytes
		if (buf.size() < 16) return false;

		restart_read_timeout();

		// skip header
		buf = buf.subspan(8);

		// reset transaction
		update_transaction_id();
		std::int64_t const connection_id = aux::read_int64(buf);

		std::lock_guard<std::mutex> l(m_cache_mutex);
		connection_cache_entry& cce = m_connection_cache[m_target.address()];
		cce.connection_id = connection_id;
		cce.expires = aux::time_now() + seconds(m_man.settings().get_int(settings_pack::udp_tracker_token_expiry));

		if (!(tracker_req().kind & tracker_request::scrape_request))
			send_udp_announce();
		else if (tracker_req().kind & tracker_request::scrape_request)
			send_udp_scrape();
		return true;
	}